

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedPumpFrom::tryRead
          (BlockedPumpFrom *this,void *readBuffer,size_t minBytes,size_t maxBytes)

{
  PromiseArena *params;
  _func_int **pp_Var1;
  OwnPromiseNode OVar2;
  PromiseBase this_00;
  void *pvVar3;
  _func_int **in_R8;
  PromiseArena *pPVar4;
  PromiseArena *pPVar5;
  TransformPromiseNodeBase *this_01;
  bool bVar6;
  OwnPromiseNode local_88;
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_7f;
  OwnPromiseNode local_58;
  PromiseBase local_50;
  Fault f;
  
  bVar6 = *(long *)((long)readBuffer + 0x38) == 0;
  _kjCondition.value = bVar6;
  local_50.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this;
  if (bVar6) {
    params = (PromiseArena *)((long)readBuffer + 0x38);
    pPVar4 = (PromiseArena *)
             (*(long *)((long)readBuffer + 0x28) - *(long *)((long)readBuffer + 0x30));
    pPVar5 = (PromiseArena *)maxBytes;
    if (pPVar4 < maxBytes) {
      pPVar5 = pPVar4;
    }
    (**(code **)(**(long **)((long)readBuffer + 0x20) + 8))
              (&local_88,*(long **)((long)readBuffer + 0x20),minBytes,pPVar5);
    OVar2.ptr = local_88.ptr;
    pp_Var1 = *(_func_int ***)((long)readBuffer + 0x10);
    pPVar4 = ((local_88.ptr)->super_PromiseArenaMember).arena;
    if (pPVar4 == (PromiseArena *)0x0 || (ulong)((long)local_88.ptr - (long)pPVar4) < 0x58) {
      pvVar3 = operator_new(0x400);
      this_01 = (TransformPromiseNodeBase *)((long)pvVar3 + 0x3a8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_01,&local_88,
                 kj::_::
                 TransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:780:17),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:465:12)>
                 ::anon_class_40_5_41c1fbba_for_func::operator());
      *(undefined ***)((long)pvVar3 + 0x3a8) = &PTR_destroy_00622bc0;
      *(void **)((long)pvVar3 + 0x3c8) = readBuffer;
      *(size_t *)((long)pvVar3 + 0x3d0) = minBytes;
      *(size_t *)((long)pvVar3 + 0x3d8) = maxBytes;
      *(_func_int ***)((long)pvVar3 + 0x3e0) = in_R8;
      *(PromiseArena **)((long)pvVar3 + 1000) = pPVar5;
      *(_func_int ***)((long)pvVar3 + 0x3f0) = pp_Var1;
      *(PromiseArena **)((long)pvVar3 + 0x3f8) = params;
      *(void **)((long)pvVar3 + 0x3b0) = pvVar3;
    }
    else {
      ((local_88.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
      this_01 = (TransformPromiseNodeBase *)&local_88.ptr[-6].super_PromiseArenaMember.arena;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_01,&local_88,
                 kj::_::
                 TransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:780:17),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:465:12)>
                 ::anon_class_40_5_41c1fbba_for_func::operator());
      OVar2.ptr[-6].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_00622bc0;
      OVar2.ptr[-4].super_PromiseArenaMember.arena = (PromiseArena *)readBuffer;
      OVar2.ptr[-3].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)minBytes;
      OVar2.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)maxBytes;
      OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = in_R8;
      OVar2.ptr[-2].super_PromiseArenaMember.arena = pPVar5;
      OVar2.ptr[-1].super_PromiseArenaMember._vptr_PromiseArenaMember = pp_Var1;
      OVar2.ptr[-1].super_PromiseArenaMember.arena = params;
      OVar2.ptr[-5].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar4;
    }
    f.exception = (Exception *)anon_var_dwarf_9cffe6;
    __kjCondition = &this_01->super_PromiseNode;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)&local_58,(OwnPromiseNode *)&_kjCondition,(SourceLocation *)&f);
    this_00.node.ptr = local_50.node.ptr;
    OVar2.ptr = __kjCondition;
    if ((TransformPromiseNodeBase *)__kjCondition != (TransformPromiseNodeBase *)0x0) {
      __kjCondition = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
    }
    kj::_::PromiseDisposer::
    alloc<kj::_::AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>>,kj::_::PromiseDisposer,kj::Canceler&,kj::Promise<unsigned_long>>
              ((PromiseDisposer *)this_00.node.ptr,(Canceler *)params,
               (Promise<unsigned_long> *)&local_58);
    OVar2.ptr = local_58.ptr;
    if (&(local_58.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_58.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
    }
    OVar2.ptr = local_88.ptr;
    if (&(local_88.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_88.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
    }
    return (Promise<unsigned_long>)(PromiseNode *)this_00.node.ptr;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[16]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
             ,0x306,FAILED,"canceler.isEmpty()","_kjCondition,\"already pumping\"",&_kjCondition,
             (char (*) [16])"already pumping");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

TwoWayPipe newTwoWayPipe() {
  auto pipe1 = kj::refcounted<AsyncPipe>();
  auto pipe2 = kj::refcounted<AsyncPipe>();
  auto end1 = kj::heap<TwoWayPipeEnd>(kj::addRef(*pipe1), kj::addRef(*pipe2));
  auto end2 = kj::heap<TwoWayPipeEnd>(kj::mv(pipe2), kj::mv(pipe1));
  return { { kj::mv(end1), kj::mv(end2) } };
}